

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

bool __thiscall rcg::Buffer::getImagePresent(Buffer *this,uint32_t part)

{
  void *pvVar1;
  unsigned_long uVar2;
  bool bVar3;
  
  if (this->multipart == true) {
    pvVar1 = Stream::getHandle(this->parent);
    uVar2 = anon_unknown_6::getBufferPartValue<unsigned_long>
                      (&this->gentl,pvVar1,this->buffer,part,2);
    bVar3 = uVar2 - 1 < 9;
  }
  else if ((this->payload_type != 4) ||
          (bVar3 = true,
          (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0)) {
    pvVar1 = Stream::getHandle(this->parent);
    bVar3 = anon_unknown_6::getBufferBool(&this->gentl,pvVar1,this->buffer,0x11);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool Buffer::getImagePresent(uint32_t part) const
{
  if (multipart)
  {
    size_t type=getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                           GenTL::BUFFER_PART_INFO_DATA_TYPE);

    bool ret;

    switch (type)
    {
      case PART_DATATYPE_2D_IMAGE:
      case PART_DATATYPE_2D_PLANE_BIPLANAR:
      case PART_DATATYPE_2D_PLANE_TRIPLANAR:
      case PART_DATATYPE_2D_PLANE_QUADPLANAR:
      case PART_DATATYPE_3D_IMAGE:
      case PART_DATATYPE_3D_PLANE_BIPLANAR:
      case PART_DATATYPE_3D_PLANE_TRIPLANAR:
      case PART_DATATYPE_3D_PLANE_QUADPLANAR:
      case PART_DATATYPE_CONFIDENCE_MAP:
        ret=true;
        break;

      default:
        ret=false;
        break;
    }

    return ret;
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      return true;
    }

    return getBufferBool(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_IMAGEPRESENT);
  }
}